

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t * Acb_NtkCollectUser(Acb_Ntk_t *p,Vec_Ptr_t *vUser)

{
  uint uVar1;
  char *pStr;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  void *__s;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  iVar3 = vUser->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar3 - 1U < 0xf) {
    iVar3 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
  }
  p_00->pArray = piVar5;
  iVar2 = Abc_NamObjNumMax(p->pDesign->pStrs);
  iVar3 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar3 = iVar2;
  }
  if (iVar3 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar3 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar2 << 2);
  }
  uVar6 = (ulong)(p->vObjType).nSize;
  if (1 < (long)uVar6) {
    uVar4 = (p->vObjType).nSize;
    uVar7 = 1;
    if (1 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    uVar8 = 1;
    do {
      if (uVar7 == uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar4 = (uint)(byte)(p->vObjType).pArray[uVar8];
      if ((4 < uVar4) || ((0x19U >> (uVar4 & 0x1f) & 1) == 0)) {
        uVar10 = (ulong)(p->vObjName).nSize;
        if ((long)uVar10 < 1) {
          __assert_fail("Acb_NtkHasObjNames(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
        }
        if (uVar10 <= uVar8) goto LAB_00387621;
        iVar3 = (p->vObjName).pArray[uVar8];
        if (0 < (long)iVar3) {
          uVar10 = (ulong)(p->vObjCopy).nSize;
          if ((long)uVar10 < 1) {
            __assert_fail("Acb_NtkHasObjCopies(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
          }
          if (uVar10 <= uVar8) goto LAB_00387621;
          if (iVar2 <= iVar3) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)__s + (long)iVar3 * 4) = (p->vObjCopy).pArray[uVar8];
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  uVar4 = vUser->nSize;
  if (0 < (int)uVar4) {
    lVar9 = 0;
    do {
      pStr = (char *)vUser->pArray[lVar9];
      iVar3 = Abc_NamStrFind(p->pDesign->pStrs,pStr);
      if (iVar3 < iVar2) {
        uVar4 = Abc_NamStrFind(p->pDesign->pStrs,pStr);
        if (((int)uVar4 < 0) || (iVar2 <= (int)uVar4)) {
LAB_00387621:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = *(uint *)((long)__s + (ulong)uVar4 * 4);
        if ((int)uVar4 < 1) {
          __assert_fail("iLit > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                        ,0x268,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
        }
        Vec_IntPush(p_00,uVar4 >> 1);
      }
      lVar9 = lVar9 + 1;
      uVar4 = vUser->nSize;
    } while (lVar9 < (int)uVar4);
  }
  uVar1 = p_00->nSize;
  if (uVar1 != uVar4) {
    __assert_fail("Vec_IntSize(vRes) == Vec_PtrSize(vUser)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                  ,0x26c,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (1 < (int)uVar1) {
    piVar5 = p_00->pArray;
    qsort(piVar5,(ulong)uVar1,4,Vec_IntSortCompare1);
    iVar3 = 1;
    uVar6 = 1;
    do {
      if (piVar5[uVar6] != piVar5[uVar6 - 1]) {
        lVar9 = (long)iVar3;
        iVar3 = iVar3 + 1;
        piVar5[lVar9] = piVar5[uVar6];
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
    p_00->nSize = iVar3;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectUser( Acb_Ntk_t * p, Vec_Ptr_t * vUser )
{
    char * pTemp; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( Vec_PtrSize(vUser) );
    Vec_Int_t * vMap = Vec_IntStart( Abc_NamObjNumMax(Acb_NtkNam(p)) );
    Acb_NtkForEachNode( p, i )
        if ( Acb_ObjName(p, i) > 0 )
            Vec_IntWriteEntry( vMap, Acb_ObjName(p, i), Acb_ObjCopy(p, i) );
    Vec_PtrForEachEntry( char *, vUser, pTemp, i )
        if ( Acb_NtkStrId(p, pTemp) < Vec_IntSize(vMap) )
        {
            int iLit = Vec_IntEntry( vMap, Acb_NtkStrId(p, pTemp) );
            assert( iLit > 0 );
            //printf( "Obj = %3d  Name = %3d  Copy = %3d\n", i, Acb_NtkStrId(p, pTemp), iLit );
            Vec_IntPush( vRes, Abc_Lit2Var(iLit) );
        }
    assert( Vec_IntSize(vRes) == Vec_PtrSize(vUser) );
    Vec_IntFree( vMap );
    Vec_IntUniqify( vRes );
    return vRes;
}